

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpExtensions.cpp
# Opt level: O2

void __thiscall
GrpTokenStreamFilter::ReportLexerError(GrpTokenStreamFilter *this,ScannerException *ex)

{
  int iVar1;
  int iVar2;
  string asStack_88 [32];
  string local_68;
  undefined1 local_48 [40];
  
  iVar2 = (**(code **)(*(long *)&ex->super_ANTLRException + 0x30))(ex);
  iVar1 = this->m_nLineOffset;
  (**(code **)(*(long *)&ex->super_ANTLRException + 0x28))(&local_68,ex);
  std::__cxx11::string::string(asStack_88,(string *)&this->m_staFile);
  local_48._4_4_ = iVar1 + iVar2;
  local_48._0_4_ = iVar2;
  std::__cxx11::string::string((string *)(local_48 + 8),asStack_88);
  AddGlobalError(true,0x65,&local_68,(GrpLineAndFile *)local_48);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  std::__cxx11::string::~string(asStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void GrpTokenStreamFilter::ReportLexerError(const ScannerException & ex)
{
	int nLinePre = ex.getLine();
	int nLineOrig = nLinePre + m_nLineOffset;
	AddGlobalError(true, 101, ex.getErrorMessage(), GrpLineAndFile(nLinePre, nLineOrig, m_staFile));
}